

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_array(Parser *this)

{
  Type TVar1;
  pointer pTVar2;
  Token *pTVar3;
  pointer pTVar4;
  AbstractSyntaxNode *pAVar5;
  ostream *poVar6;
  parser_exception *this_00;
  int iVar7;
  stringstream buffer;
  string local_340;
  TokenPosition local_320;
  Token local_308;
  Token local_2b0;
  Token local_258;
  Token local_200;
  Type local_1a8 [4];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  local_1a8[0] = kArray;
  pAVar5 = AbstractSyntaxNode::add_child
                     (this->current_,local_1a8,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar5;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  local_340._M_dataplus._M_p._0_4_ = 0xd;
  match(&local_200,this,(Type *)&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.content_._M_dataplus._M_p != &local_200.content_.field_2) {
    operator_delete(local_200.content_._M_dataplus._M_p);
  }
  iVar7 = this->index_ % this->total_;
  pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = pTVar2 + iVar7;
  TVar1 = pTVar2[iVar7].type_;
  if (TVar1 == kIdentity) {
    AbstractSyntaxNode::add_child(this->current_,pTVar3);
    local_340._M_dataplus._M_p._0_4_ = 0x21;
    match(&local_2b0,this,(Type *)&local_340);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0.extra_);
    pTVar3 = &local_2b0;
    local_258.content_._M_dataplus._M_p = local_2b0.content_._M_dataplus._M_p;
  }
  else {
    if (TVar1 != kIntegerLiteral) {
      std::__ostream_insert<char,std::char_traits<char>>(local_198,anon_var_dwarf_985ac,0x14);
      Token::content_abi_cxx11_
                (&local_340,
                 (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start + this->index_ % this->total_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_198,
                          (char *)CONCAT44(local_340._M_dataplus._M_p._4_4_,
                                           local_340._M_dataplus._M_p._0_4_),
                          local_340._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,anon_var_dwarf_98654,0x4a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_340._M_dataplus._M_p._4_4_,local_340._M_dataplus._M_p._0_4_) !=
          &local_340.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_340._M_dataplus._M_p._4_4_,local_340._M_dataplus._M_p._0_4_))
        ;
      }
      this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
      iVar7 = this->index_ % this->total_;
      pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4 = pTVar2 + iVar7;
      local_320.super_Position.row_ = (pTVar4->position_).super_Position.row_;
      local_320.super_Position.col_ = (pTVar4->position_).super_Position.col_;
      local_320.super_Position._vptr_Position = (_func_int **)&PTR_clear_001539d0;
      local_320.length_ = pTVar2[iVar7].position_.length_;
      std::__cxx11::stringbuf::str();
      parser_exception::parser_exception(this_00,&local_320,&local_340);
      __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
    AbstractSyntaxNode::add_child(this->current_,pTVar3);
    local_340._M_dataplus._M_p._0_4_ = 0x22;
    match(&local_258,this,(Type *)&local_340);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258.extra_);
    pTVar3 = &local_258;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.content_._M_dataplus._M_p != &(pTVar3->content_).field_2) {
    operator_delete(local_258.content_._M_dataplus._M_p);
  }
  local_340._M_dataplus._M_p._0_4_ = 0xe;
  match(&local_308,this,(Type *)&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.content_._M_dataplus._M_p != &local_308.content_.field_2) {
    operator_delete(local_308.content_._M_dataplus._M_p);
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void Parser::parse_array() {
    current_ = current_->add_child(Token::Type::kArray, forward_token());
    std::stringstream buffer;

    match(Token::Type::kLeftBracket);
    if (forward_token().type() == Token::Type::kIntegerLiteral) {
        current_->add_child(forward_token());
        match(Token::Type::kIntegerLiteral);
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 数组括号中仅允许整数常量或变量(变量仅限用作左值)";
        throw parser_exception(forward_token().position(), buffer.str());
    }
    match(Token::Type::kRightBracket);

    current_ = current_->parent();
}